

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testToFloat.cpp
# Opt level: O0

void testToFloat(void)

{
  bool bVar1;
  uint16_t uVar2;
  float fVar3;
  uint uVar4;
  ostream *poVar5;
  uif uif;
  half h;
  float f;
  half hs;
  uint s;
  int iMax;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint local_8;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"running testToFloat");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_8 = 0;
  do {
    if (0xffff < local_8) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ok");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return;
    }
    Imath_3_2::half::half((half *)&stack0xfffffffffffffff6,FromBits,(uint16_t)local_8);
    uVar2 = Imath_3_2::half::bits((half *)&stack0xfffffffffffffff6);
    if (uVar2 != local_8) {
      __assert_fail("hs.bits () == s",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                    ,0x6f,"void testToFloat()");
    }
    in_stack_fffffffffffffff0 =
         Imath_3_2::half::operator_cast_to_float
                   ((half *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    Imath_3_2::half::half
              ((half *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
    fVar3 = (float)halfToFloat((uint16_t)local_8);
    uVar4 = std::isnan((double)(ulong)(uint)in_stack_fffffffffffffff0);
    if ((uVar4 & 1) == 0) {
      uVar4 = std::isinf((double)(ulong)(uint)in_stack_fffffffffffffff0);
      if ((uVar4 & 1) == 0) {
        if ((in_stack_fffffffffffffff0 != fVar3) || (NAN(in_stack_fffffffffffffff0) || NAN(fVar3)))
        {
          __assert_fail("f == uif.f",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                        ,0x98,"void testToFloat()");
        }
      }
      else {
        bVar1 = Imath_3_2::half::isInfinity
                          ((half *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
        if (!bVar1) {
          __assert_fail("h.isInfinity ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                        ,0x93,"void testToFloat()");
        }
        uVar4 = std::isinf((double)(ulong)(uint)fVar3);
        if ((uVar4 & 1) == 0) {
          __assert_fail("isinf (uif.f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                        ,0x94,"void testToFloat()");
        }
      }
    }
    else {
      bVar1 = Imath_3_2::half::isNan
                        ((half *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      if (!bVar1) {
        __assert_fail("h.isNan ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x8e,"void testToFloat()");
      }
      uVar4 = std::isnan((double)(ulong)(uint)fVar3);
      if ((uVar4 & 1) == 0) {
        __assert_fail("isnan (uif.f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x8f,"void testToFloat()");
      }
    }
    local_8 = local_8 + 1;
  } while( true );
}

Assistant:

void
testToFloat ()
{
    std::cout << "running testToFloat" << std::endl;

    constexpr int iMax = (1 << 16);

    //
    // for each 16-bit bit pattern...
    //

    for (unsigned int s = 0; s < iMax; s++)
    {
        half hs (half::FromBits, static_cast<unsigned short> (s));
        assert (hs.bits () == s);

        //
        // cast these bits to a float, using the cast-to-float
        // operator.
        //

        float f = float (hs); // = _toFloat[s]

        //
        // Cast that float back to a half.
        //

        half h = half (f);

        //
        // halfToFloat() above is what generated the _toFloat table.
        // The i value return is the integer bit pattern of the corresponding
        // float.
        //

        half::uif uif;
        uif.i = halfToFloat (s);

        //
        // Equality operators fail for inf and nan, so handle them
        // specially.
        //

        if (isnan (f))
        {
            assert (h.isNan ());
            assert (isnan (uif.f));
        }
        else if (isinf (f))
        {
            assert (h.isInfinity ());
            assert (isinf (uif.f));
        }
        else
        {
            assert (f == uif.f);
        }
    }

    std::cout << "ok" << std::endl;
}